

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_ReservedExtensionRangeAdjacent_Test::
~ValidationErrorTest_ReservedExtensionRangeAdjacent_Test
          (ValidationErrorTest_ReservedExtensionRangeAdjacent_Test *this)

{
  ValidationErrorTest_ReservedExtensionRangeAdjacent_Test *this_local;
  
  ~ValidationErrorTest_ReservedExtensionRangeAdjacent_Test(this);
  operator_delete(this,0x88);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, ReservedExtensionRangeAdjacent) {
  BuildFile(
      "name: \"foo.proto\" "
      "message_type {"
      "  name: \"Foo\""
      "  extension_range { start: 10 end: 20 }"
      "  reserved_range { start: 5 end: 10 }"
      "}");
}